

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transfer_function_widget.cpp
# Opt level: O0

void __thiscall
tfnw::TransferFunctionWidget::get_colormapf
          (TransferFunctionWidget *this,vector<float,_std::allocator<float>_> *color,
          vector<float,_std::allocator<float>_> *opacity)

{
  byte bVar1;
  size_type sVar2;
  byte *pbVar3;
  reference pvVar4;
  ulong local_28;
  size_t i;
  vector<float,_std::allocator<float>_> *opacity_local;
  vector<float,_std::allocator<float>_> *color_local;
  TransferFunctionWidget *this_local;
  
  this->colormap_changed = false;
  sVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&this->current_colormap);
  std::vector<float,_std::allocator<float>_>::resize(color,(sVar2 >> 2) * 3);
  sVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&this->current_colormap);
  std::vector<float,_std::allocator<float>_>::resize(opacity,sVar2 >> 2);
  local_28 = 0;
  while( true ) {
    sVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                      (&this->current_colormap);
    if (sVar2 >> 2 <= local_28) break;
    pbVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       (&this->current_colormap,local_28 << 2);
    bVar1 = *pbVar3;
    pvVar4 = std::vector<float,_std::allocator<float>_>::operator[](color,local_28 * 3);
    *pvVar4 = (float)bVar1 / 255.0;
    pbVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       (&this->current_colormap,local_28 * 4 + 1);
    bVar1 = *pbVar3;
    pvVar4 = std::vector<float,_std::allocator<float>_>::operator[](color,local_28 * 3 + 1);
    *pvVar4 = (float)bVar1 / 255.0;
    pbVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       (&this->current_colormap,local_28 * 4 + 2);
    bVar1 = *pbVar3;
    pvVar4 = std::vector<float,_std::allocator<float>_>::operator[](color,local_28 * 3 + 2);
    *pvVar4 = (float)bVar1 / 255.0;
    pbVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       (&this->current_colormap,local_28 * 4 + 3);
    bVar1 = *pbVar3;
    pvVar4 = std::vector<float,_std::allocator<float>_>::operator[](opacity,local_28);
    *pvVar4 = (float)bVar1 / 255.0;
    local_28 = local_28 + 1;
  }
  return;
}

Assistant:

void TransferFunctionWidget::get_colormapf(std::vector<float> &color,
                                           std::vector<float> &opacity)
{
    colormap_changed = false;
    color.resize((current_colormap.size() / 4) * 3);
    opacity.resize(current_colormap.size() / 4);
    for (size_t i = 0; i < current_colormap.size() / 4; ++i) {
        color[i * 3] = current_colormap[i * 4] / 255.f;
        color[i * 3 + 1] = current_colormap[i * 4 + 1] / 255.f;
        color[i * 3 + 2] = current_colormap[i * 4 + 2] / 255.f;
        opacity[i] = current_colormap[i * 4 + 3] / 255.f;
    }
}